

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverAlgebraicMultiply(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar1;
  bool bVar2;
  Mvc_List_t *pList;
  uint local_40;
  int _i__1;
  int _i_;
  int CompResult;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube1;
  Mvc_Cover_t *pCover;
  Mvc_Cover_t *pCover2_local;
  Mvc_Cover_t *pCover1_local;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcOpAlg.c"
                  ,0x32,"Mvc_Cover_t *Mvc_CoverAlgebraicMultiply(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  Mvc_CoverAllocateMask(pCover1);
  Mvc_CoverAllocateMask(pCover2);
  Mvc_CoverSupport(pCover1,pCover1->pMask);
  Mvc_CoverSupport(pCover2,pCover2->pMask);
  if ((*(uint *)&pCover1->pMask->field_0x8 & 0xffffff) == 0) {
    bVar2 = (pCover1->pMask->pData[0] & pCover2->pMask->pData[0]) == 0;
  }
  else if ((*(uint *)&pCover1->pMask->field_0x8 & 0xffffff) == 1) {
    bVar2 = false;
    if ((pCover1->pMask->pData[0] & pCover2->pMask->pData[0]) == 0) {
      bVar2 = (*(uint *)&pCover1->pMask->field_0x14 & *(uint *)&pCover2->pMask->field_0x14) == 0;
    }
  }
  else {
    bVar2 = true;
    for (local_40 = *(uint *)&pCover1->pMask->field_0x8 & 0xffffff; -1 < (int)local_40;
        local_40 = local_40 - 1) {
      if ((pCover1->pMask->pData[(int)local_40] & pCover2->pMask->pData[(int)local_40]) != 0) {
        bVar2 = false;
        break;
      }
    }
  }
  if (!bVar2) {
    printf("Mvc_CoverMultiply(): Cover supports are not disjoint!\n");
  }
  pCover_00 = Mvc_CoverClone(pCover1);
  for (pCube2 = (pCover1->lCubes).pHead; pCube2 != (Mvc_Cube_t *)0x0; pCube2 = pCube2->pNext) {
    for (pCube = (pCover2->lCubes).pHead; pCube != (Mvc_Cube_t *)0x0; pCube = pCube->pNext) {
      pMVar1 = Mvc_CubeAlloc(pCover_00);
      if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 0) {
        pMVar1->pData[0] = pCube2->pData[0] | pCube->pData[0];
      }
      else if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 1) {
        pMVar1->pData[0] = pCube2->pData[0] | pCube->pData[0];
        *(uint *)&pMVar1->field_0x14 = *(uint *)&pCube2->field_0x14 | *(uint *)&pCube->field_0x14;
      }
      else {
        for (pList._4_4_ = *(uint *)&pCube2->field_0x8 & 0xffffff; -1 < (int)pList._4_4_;
            pList._4_4_ = pList._4_4_ - 1) {
          pMVar1->pData[(int)pList._4_4_] =
               pCube2->pData[(int)pList._4_4_] | pCube->pData[(int)pList._4_4_];
        }
      }
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar1;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar1;
      }
      (pCover_00->lCubes).pTail = pMVar1;
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    }
  }
  return pCover_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Multiplies two disjoint-support covers.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cover_t * Mvc_CoverAlgebraicMultiply( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube1, * pCube2, * pCube;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // make sure that supports do not overlap
    Mvc_CoverAllocateMask( pCover1 );
    Mvc_CoverAllocateMask( pCover2 );
    Mvc_CoverSupport( pCover1, pCover1->pMask );
    Mvc_CoverSupport( pCover2, pCover2->pMask );
    // check if the cubes are bit-wise disjoint
    Mvc_CubeBitDisjoint( CompResult, pCover1->pMask, pCover2->pMask );
    if ( !CompResult )
        printf( "Mvc_CoverMultiply(): Cover supports are not disjoint!\n" );

    // iterate through the cubes
    pCover = Mvc_CoverClone( pCover1 );
    Mvc_CoverForEachCube( pCover1, pCube1 )
        Mvc_CoverForEachCube( pCover2, pCube2 )
        { 
            // create the product cube
            pCube = Mvc_CubeAlloc( pCover );
            // set the product cube equal to the product of the two cubes
            Mvc_CubeBitOr( pCube, pCube1, pCube2 );
            // add the cube to the cover
            Mvc_CoverAddCubeTail( pCover, pCube );
        }
    return pCover;
}